

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<std::__cxx11::string,char[19],unsigned_long,char[9]>
          (string *__return_storage_ptr__,Diligent *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args,
          char (*Args_1) [19],unsigned_long *Args_2,char (*Args_3) [9])

{
  stringstream local_1b8 [8];
  stringstream ss;
  char (*Args_local_3) [9];
  unsigned_long *Args_local_2;
  char (*Args_local_1) [19];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[19],unsigned_long,char[9]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [19])Args,(unsigned_long *)Args_1,(char (*) [9])Args_2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}